

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

void __thiscall cmSourceFile::SetProperty(cmSourceFile *this,string *prop,char *value)

{
  cmMakefile *this_00;
  int iVar1;
  
  cmPropertyMap::SetProperty(&this->Properties,prop,value);
  if (this->IsUiFile == true) {
    this_00 = (this->Location).Makefile;
    iVar1 = std::__cxx11::string::compare((char *)prop);
    if (iVar1 == 0) {
      cmMakefile::AddQtUiFileWithOptions(this_00,this);
      return;
    }
  }
  return;
}

Assistant:

void cmSourceFile::SetProperty(const std::string& prop, const char* value)
{
  this->Properties.SetProperty(prop, value);

  if (this->IsUiFile) {
    cmMakefile const* mf = this->Location.GetMakefile();
    if (prop == "AUTOUIC_OPTIONS") {
      const_cast<cmMakefile*>(mf)->AddQtUiFileWithOptions(this);
    }
  }
}